

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

CTypeID lj_ccall_ctid_vararg(CTState *cts,cTValue *o)

{
  ushort uVar1;
  uint uVar2;
  CTypeID CVar3;
  ulong uVar4;
  
  uVar4 = o->it64 >> 0x2f;
  if (uVar4 < 0xfffffffffffffff3) {
    return 0xe;
  }
  if (uVar4 + 3 < 2) {
    CVar3 = 3;
  }
  else if (uVar4 == 0xfffffffffffffffb) {
    CVar3 = 0x13;
  }
  else {
    if (uVar4 == 0xfffffffffffffff5) {
      uVar1 = *(ushort *)((o->it64 & 0x7fffffffffffU) + 10);
      uVar2 = cts->tab[uVar1].info;
      if ((uVar2 & 0xfc000000) == 0x30000000) {
        CVar3 = lj_ctype_intern(cts,uVar2 & 0xffff | 0x20030000,8);
        return CVar3;
      }
      if ((uVar2 >> 0x1c != 6) && (uVar2 >> 0x1c != 1)) {
        if (((uVar2 & 0xf4000000) == 0x4000000) && (cts->tab[uVar1].size == 4)) {
          return 0xe;
        }
        return (CTypeID)uVar1;
      }
      CVar3 = lj_ctype_intern(cts,uVar1 | 0x20030000,8);
      return CVar3;
    }
    CVar3 = 0x11;
  }
  return CVar3;
}

Assistant:

CTypeID lj_ccall_ctid_vararg(CTState *cts, cTValue *o)
{
  if (tvisnumber(o)) {
    return CTID_DOUBLE;
  } else if (tviscdata(o)) {
    CTypeID id = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, id);
    if (ctype_isrefarray(s->info)) {
      return lj_ctype_intern(cts,
	       CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(s->info)), CTSIZE_PTR);
    } else if (ctype_isstruct(s->info) || ctype_isfunc(s->info)) {
      /* NYI: how to pass a struct by value in a vararg argument? */
      return lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR);
    } else if (ctype_isfp(s->info) && s->size == sizeof(float)) {
      return CTID_DOUBLE;
    } else {
      return id;
    }
  } else if (tvisstr(o)) {
    return CTID_P_CCHAR;
  } else if (tvisbool(o)) {
    return CTID_BOOL;
  } else {
    return CTID_P_VOID;
  }
}